

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

FunctionCallVar * __thiscall
kratos::Generator::call
          (Generator *this,string *func_name,
          vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_> *args
          )

{
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *pvVar1;
  size_type *psVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  size_t *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar4;
  size_t sVar5;
  char cVar6;
  int iVar7;
  iterator iVar8;
  mapped_type *pmVar9;
  UserException *pUVar10;
  ulong uVar11;
  char cVar12;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  ulong __val;
  string_view format_str;
  format_args args_00;
  undefined1 local_c8 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  mock_args;
  shared_ptr<kratos::FunctionCallVar> p;
  undefined1 local_68 [8];
  mapped_type func_def;
  string __str;
  
  iVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
          ::find(&(this->funcs_)._M_t,func_name);
  if ((_Rb_tree_header *)iVar8._M_node == &(this->funcs_)._M_t._M_impl.super__Rb_tree_header) {
    pUVar10 = (UserException *)__cxa_allocate_exception(0x10);
    mock_args._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)(func_name->_M_dataplus)._M_p;
    p.super___shared_ptr<kratos::FunctionCallVar,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)func_name->_M_string_length;
    format_str.size_ = 0xd;
    format_str.data_ = (char *)0x16;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&mock_args._M_t._M_impl.super__Rb_tree_header._M_node_count;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)local_c8,(detail *)"function {0} not found",format_str,args_00);
    UserException::UserException(pUVar10,(string *)local_c8);
    __cxa_throw(pUVar10,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
           ::at(&this->funcs_,func_name);
  local_68 = (undefined1  [8])
             (pmVar9->super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
  func_def.super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (pmVar9->super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if (func_def.super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      pvVar1 = &((func_def.super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->super_StmtBlock).super_Stmt.super_IRNode.fn_name_ln;
      *(int *)&(pvVar1->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(pvVar1->
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 1;
      UNLOCK();
    }
    else {
      pvVar1 = &((func_def.super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->super_StmtBlock).super_Stmt.super_IRNode.fn_name_ln;
      *(int *)&(pvVar1->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(pvVar1->
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 1;
    }
  }
  iVar7 = (*(((element_type *)local_68)->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0x10]
          )();
  if ((char)iVar7 == '\0') {
    pUVar10 = (UserException *)__cxa_allocate_exception(0x10);
    local_c8 = (undefined1  [8])&mock_args._M_t._M_impl.super__Rb_tree_header;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_c8,"Only built-in function can be called without arg names","");
    UserException::UserException(pUVar10,(string *)local_c8);
    __cxa_throw(pUVar10,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  mock_args._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&mock_args;
  mock_args._M_t._M_impl._0_4_ = 0;
  mock_args._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  mock_args._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  mock_args._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  mock_args._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       mock_args._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if ((args->
      super__Vector_base<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (args->
      super__Vector_base<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    psVar2 = &__str._M_string_length;
    p_Var3 = &p.super___shared_ptr<kratos::FunctionCallVar,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    __val = 0;
    do {
      cVar12 = '\x01';
      if (9 < __val) {
        uVar11 = __val;
        cVar6 = '\x04';
        do {
          cVar12 = cVar6;
          if (uVar11 < 100) {
            cVar12 = cVar12 + -2;
            goto LAB_00176192;
          }
          if (uVar11 < 1000) {
            cVar12 = cVar12 + -1;
            goto LAB_00176192;
          }
          if (uVar11 < 10000) goto LAB_00176192;
          bVar4 = 99999 < uVar11;
          uVar11 = uVar11 / 10000;
          cVar6 = cVar12 + '\x04';
        } while (bVar4);
        cVar12 = cVar12 + '\x01';
      }
LAB_00176192:
      func_def.super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar2;
      std::__cxx11::string::_M_construct
                ((ulong)&func_def.
                         super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount,cVar12);
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)func_def.
                         super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi,(uint)__str._M_dataplus._M_p,__val);
      mock_args._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)p_Var3;
      if (func_def.super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar2) {
        mock_args._M_t._M_impl.super__Rb_tree_header._M_node_count =
             (size_t)func_def.
                     super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
      }
      p.super___shared_ptr<kratos::FunctionCallVar,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _1_7_ = __str._M_string_length._1_7_;
      p.super___shared_ptr<kratos::FunctionCallVar,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _0_1_ = (undefined1)__str._M_string_length;
      p.super___shared_ptr<kratos::FunctionCallVar,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)__str._M_dataplus._M_p;
      __str._M_dataplus._M_p = (pointer)0x0;
      __str._M_string_length._0_1_ = 0;
      this_01 = (args->
                super__Vector_base<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>
                )._M_impl.super__Vector_impl_data._M_start[__val].
                super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
        }
      }
      func_def.super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar2;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,std::shared_ptr<kratos::Var>>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
                  *)local_c8,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>
                  *)&mock_args._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
          mock_args._M_t._M_impl.super__Rb_tree_header._M_node_count != p_Var3) {
        operator_delete((void *)mock_args._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        (ulong)((long)&(p.
                                        super___shared_ptr<kratos::FunctionCallVar,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
      }
      if (func_def.super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar2) {
        operator_delete(func_def.
                        super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi,
                        CONCAT71(__str._M_string_length._1_7_,(undefined1)__str._M_string_length) +
                        1);
      }
      __val = __val + 1;
    } while (__val < (ulong)((long)(args->
                                   super__Vector_base<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(args->
                                   super__Vector_base<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  func_def.super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  iVar7 = (*(((StmtBlock *)local_68)->super_Stmt).super_IRNode._vptr_IRNode[0xe])();
  __str.field_2._M_local_buf[0xf] = (char)iVar7;
  mock_args._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<kratos::FunctionCallVar,std::allocator<kratos::FunctionCallVar>,kratos::Generator*,std::shared_ptr<kratos::FunctionStmtBlock>&,std::map<std::__cxx11::string,std::shared_ptr<kratos::Var>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>&,bool>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p,
             (FunctionCallVar **)&mock_args._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (allocator<kratos::FunctionCallVar> *)((long)&__str.field_2 + 0xe),
             (Generator **)
             &func_def.super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(shared_ptr<kratos::FunctionStmtBlock> *)local_68,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
              *)local_c8,(bool *)(__str.field_2._M_local_buf + 0xf));
  this_00 = &mock_args._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::__shared_ptr<kratos::FunctionCallVar,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<kratos::FunctionCallVar,kratos::FunctionCallVar>
            ((__shared_ptr<kratos::FunctionCallVar,(__gnu_cxx::_Lock_policy)2> *)this_00,
             (FunctionCallVar *)mock_args._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<std::shared_ptr<kratos::FunctionCallVar>,std::shared_ptr<kratos::FunctionCallVar>,std::_Identity<std::shared_ptr<kratos::FunctionCallVar>>,std::less<std::shared_ptr<kratos::FunctionCallVar>>,std::allocator<std::shared_ptr<kratos::FunctionCallVar>>>
  ::_M_emplace_unique<std::shared_ptr<kratos::FunctionCallVar>&>
            ((_Rb_tree<std::shared_ptr<kratos::FunctionCallVar>,std::shared_ptr<kratos::FunctionCallVar>,std::_Identity<std::shared_ptr<kratos::FunctionCallVar>>,std::less<std::shared_ptr<kratos::FunctionCallVar>>,std::allocator<std::shared_ptr<kratos::FunctionCallVar>>>
              *)&this->calls_,(shared_ptr<kratos::FunctionCallVar> *)this_00);
  sVar5 = mock_args._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (p.super___shared_ptr<kratos::FunctionCallVar,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               p.super___shared_ptr<kratos::FunctionCallVar,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
               *)local_c8);
  if (func_def.super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               func_def.super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
  }
  return (FunctionCallVar *)sVar5;
}

Assistant:

FunctionCallVar &Generator::call(const std::string &func_name,
                                 const std::vector<std::shared_ptr<Var>> &args) {
    if (funcs_.find(func_name) == funcs_.end())
        throw UserException(::format("function {0} not found", func_name));
    auto func_def = funcs_.at(func_name);
    if (!func_def->is_builtin())
        throw UserException("Only built-in function can be called without arg names");
    std::map<std::string, std::shared_ptr<Var>> mock_args;
    for (uint64_t i = 0; i < args.size(); i++) {
        mock_args.emplace(std::make_pair(std::to_string(i), args[i]));
    }
    auto p =
        std::make_shared<FunctionCallVar>(this, func_def, mock_args, func_def->has_return_value());
    calls_.emplace(p);
    return *p;
}